

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void MutableS2ShapeIndex::TestAllEdges
               (vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                *edges,InteriorTracker *tracker)

{
  pointer ppCVar1;
  FaceEdge *pFVar2;
  pointer ppCVar3;
  
  ppCVar1 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (edges->
                 super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    pFVar2 = (*ppCVar3)->face_edge;
    if (pFVar2->has_interior == true) {
      InteriorTracker::TestEdge(tracker,pFVar2->shape_id,&pFVar2->edge);
    }
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::TestAllEdges(const vector<const ClippedEdge*>& edges,
                                       InteriorTracker* tracker) {
  for (const ClippedEdge* edge : edges) {
    const FaceEdge* face_edge = edge->face_edge;
    if (face_edge->has_interior) {
      tracker->TestEdge(face_edge->shape_id, face_edge->edge);
    }
  }
}